

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyDowngradeTypography(TidyDocImpl *doc,Node *node)

{
  Node **ppNVar1;
  uint uVar2;
  Lexer *pLVar3;
  tmbstr ptVar4;
  Bool BVar5;
  uint uVar6;
  tmbstr buf;
  Node *pNVar7;
  uint uVar8;
  ulong uVar9;
  uint c;
  TidyDocImpl *local_40;
  Node *local_38;
  
  pLVar3 = doc->lexer;
  local_40 = doc;
  while (node != (Node *)0x0) {
    pNVar7 = node->next;
    BVar5 = prvTidynodeIsText(node);
    if (BVar5 != no) {
      uVar9 = (ulong)node->start;
      buf = pLVar3->lexbuf + uVar9;
      local_38 = pNVar7;
      while( true ) {
        ptVar4 = pLVar3->lexbuf;
        uVar8 = (uint)uVar9;
        if (node->end <= uVar8) break;
        c = (uint)(byte)ptVar4[uVar9];
        if (ptVar4[uVar9] < '\0') {
          uVar6 = prvTidyGetUTF8(ptVar4 + uVar9,&c);
          uVar8 = uVar8 + uVar6;
        }
        uVar2 = c - 0x2013;
        if ((uVar2 < 0xc) && (uVar2 < 0xc)) {
          if ((0xe0U >> (uVar2 & 0x1f) & 1) == 0) {
            if ((0xe00U >> (uVar2 & 0x1f) & 1) == 0) {
              if ((3U >> (uVar2 & 0x1f) & 1) != 0) {
                c = 0x2d;
              }
            }
            else {
              c = 0x22;
            }
          }
          else {
            c = 0x27;
          }
        }
        buf = prvTidyPutUTF8(buf,c);
        uVar9 = (ulong)(uVar8 + 1);
      }
      node->end = (int)buf - (int)ptVar4;
      pNVar7 = local_38;
    }
    ppNVar1 = &node->content;
    node = pNVar7;
    if (*ppNVar1 != (Node *)0x0) {
      prvTidyDowngradeTypography(local_40,*ppNVar1);
    }
  }
  return;
}

Assistant:

void TY_(DowngradeTypography)(TidyDocImpl* doc, Node* node)
{
    Node* next;
    Lexer* lexer = doc->lexer;

    while (node)
    {
        next = node->next;

        if (TY_(nodeIsText)(node))
        {
            uint i, c;
            tmbstr p = lexer->lexbuf + node->start;

            for (i = node->start; i < node->end; ++i)
            {
                c = (unsigned char) lexer->lexbuf[i];

                if (c > 0x7F)
                    i += TY_(GetUTF8)(lexer->lexbuf + i, &c);

                if (c >= 0x2013 && c <= 0x201E)
                {
                    switch (c)
                    {
                    case 0x2013: /* en dash */
                    case 0x2014: /* em dash */
                        c = '-';
                        break;
                    case 0x2018: /* left single  quotation mark */
                    case 0x2019: /* right single quotation mark */
                    case 0x201A: /* single low-9 quotation mark */
                        c = '\'';
                        break;
                    case 0x201C: /* left double  quotation mark */
                    case 0x201D: /* right double quotation mark */
                    case 0x201E: /* double low-9 quotation mark */
                        c = '"';
                        break;
                    }
                }

                p = TY_(PutUTF8)(p, c);
            }

            node->end = p - lexer->lexbuf;
        }

        if (node->content)
            TY_(DowngradeTypography)(doc, node->content);

        node = next;
    }
}